

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

Node * mainposition(Table *t,TValue *key)

{
  lua_CFunction p_Var1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  luai_Cast u;
  int local_20;
  int iStack_1c;
  
  uVar2 = key->tt_ & 0x3f;
  switch(uVar2) {
  case 1:
    uVar2 = ~(-1 << (t->lsizenode & 0x1f)) & (key->value_).b;
    break;
  case 3:
    dVar4 = (key->value_).n + 1.0;
    local_20 = SUB84(dVar4,0);
    iStack_1c = (int)((ulong)dVar4 >> 0x20);
    uVar3 = local_20 + iStack_1c;
    uVar2 = uVar3 & 0x7fffffff;
    if ((uVar3 & 0x7fffffff) != 0) {
      uVar2 = uVar3;
    }
    uVar2 = -uVar2;
    if (-1 < (int)uVar3) {
      uVar2 = uVar3;
    }
    uVar2 = (int)uVar2 % (int)(~(-1 << (t->lsizenode & 0x1f)) | 1U);
    break;
  case 4:
switchD_0011070f_caseD_4:
    uVar2 = ~(-1 << (t->lsizenode & 0x1f)) & *(uint *)((key->value_).f + 0xc);
    break;
  default:
    if (uVar2 == 0x14) {
      p_Var1 = (key->value_).f;
      if (p_Var1[10] == (_func_int_lua_State_ptr)0x0) {
        uVar2 = luaS_hash((char *)(p_Var1 + 0x18),*(size_t *)(p_Var1 + 0x10),*(uint *)(p_Var1 + 0xc)
                         );
        *(uint *)(p_Var1 + 0xc) = uVar2;
        p_Var1[10] = (code)0x1;
      }
      goto switchD_0011070f_caseD_4;
    }
  case 2:
    uVar2 = (uint)(key->value_).b % (~(-1 << (t->lsizenode & 0x1f)) | 1U);
  }
  return t->node + uVar2;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMBER:
      return hashnum(t, nvalue(key));
    case LUA_TLNGSTR: {
      TString *s = rawtsvalue(key);
      if (s->tsv.extra == 0) {  /* no hash? */
        s->tsv.hash = luaS_hash(getstr(s), s->tsv.len, s->tsv.hash);
        s->tsv.extra = 1;  /* now it has its hash */
      }
      return hashstr(t, rawtsvalue(key));
    }
    case LUA_TSHRSTR:
      return hashstr(t, rawtsvalue(key));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    case LUA_TLCF:
      return hashpointer(t, fvalue(key));
    default:
      return hashpointer(t, gcvalue(key));
  }
}